

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_machine.cpp
# Opt level: O1

void __thiscall
randomx::VmBase<randomx::AlignedAllocator<64UL>,_true>::~VmBase
          (VmBase<randomx::AlignedAllocator<64UL>,_true> *this)

{
  pointer pcVar1;
  
  (this->super_randomx_vm)._vptr_randomx_vm = (_func_int **)&PTR__VmBase_00135c40;
  AlignedAllocator<64UL>::freeMemory((this->super_randomx_vm).scratchpad,0x200000);
  (this->super_randomx_vm)._vptr_randomx_vm = (_func_int **)&PTR___cxa_pure_virtual_001350e8;
  pcVar1 = (this->super_randomx_vm).cacheKey._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_randomx_vm).cacheKey.field_2) {
    ::operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

VmBase<Allocator, softAes>::~VmBase() {
		Allocator::freeMemory(scratchpad, ScratchpadSize);
	}